

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerHLSL::emit_interface_block_in_struct
          (CompilerHLSL *this,SPIRVariable *var,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *active_locations)

{
  bool bVar1;
  uint32_t uVar2;
  SPIRType *pSVar3;
  CompilerError *pCVar4;
  Bitset *pBVar5;
  uint *itr;
  bool *itr_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_3;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_658;
  _Node_iterator_base<unsigned_int,_false> local_638;
  undefined1 local_630;
  value_type local_624;
  uint local_620;
  uint local_61c;
  uint32_t i_1;
  uint32_t consumed_locations;
  uint32_t local_5f4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  undefined1 local_5d0 [8];
  SPIRType decl_type;
  uint32_t local_46c;
  string local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  uint32_t local_424;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  string local_400;
  string local_3e0;
  undefined1 local_3c0 [8];
  string effective_semantic;
  SPIRType newtype;
  undefined1 local_248 [4];
  uint32_t i;
  string semantic;
  uint32_t local_21c;
  spirv_cross local_218 [4];
  uint32_t location_number;
  string name;
  anon_class_8_1_33ba97e3 get_vacant_location;
  char *local_1e8;
  string local_1e0;
  uint32_t local_1bc;
  uint32_t local_1b8;
  uint32_t location;
  uint32_t local_1a4;
  uint local_1a0;
  byte local_19b;
  byte local_19a;
  byte local_199;
  uint32_t index;
  bool legacy;
  bool need_matrix_unroll;
  bool use_location_number;
  string binding;
  SPIRType type;
  SPIREntryPoint *execution;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *active_locations_local;
  SPIRVariable *var_local;
  CompilerHLSL *this_local;
  
  type.member_name_cache._M_h._M_single_bucket =
       (__node_base_ptr)Compiler::get_entry_point((Compiler *)this);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).field_0xc);
  pSVar3 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
  SPIRType::SPIRType((SPIRType *)((long)&binding.field_2 + 8),pSVar3);
  ::std::__cxx11::string::string((string *)&index);
  local_199 = 1;
  local_19a = 0;
  local_19b = (this->hlsl_options).shader_model < 0x1f;
  if ((*(int *)&type.member_name_cache._M_h._M_single_bucket[0x1d]._M_nxt == 4) &&
     (var->storage == Output)) {
    local_1a4 = (var->super_IVariant).self.id;
    local_1a0 = Compiler::get_decoration((Compiler *)this,(ID)local_1a4,DecorationIndex);
    local_1bc = (var->super_IVariant).self.id;
    local_1b8 = Compiler::get_decoration((Compiler *)this,(ID)local_1bc,DecorationLocation);
    if ((local_1a0 != 0) && (local_1b8 != 0)) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (pCVar4,"Dual-source blending is only supported on MRT #0 in HLSL.");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    local_1e8 = "SV_Target";
    if ((local_19b & 1) != 0) {
      local_1e8 = "COLOR";
    }
    get_vacant_location.active_locations._4_4_ = local_1b8 + local_1a0;
    join<char_const*,unsigned_int>
              (&local_1e0,(spirv_cross *)&local_1e8,
               (char **)((long)&get_vacant_location.active_locations + 4),(uint *)(ulong)local_1a0);
    ::std::__cxx11::string::operator=((string *)&index,(string *)&local_1e0);
    ::std::__cxx11::string::~string((string *)&local_1e0);
    local_199 = 0;
    if ((local_19b & 1) != 0) {
      type.basetype = UByte;
    }
  }
  else if ((var->storage == Input) &&
          ((*(int *)&type.member_name_cache._M_h._M_single_bucket[0x1d]._M_nxt == 0 &&
           (local_19a = 1, (bool)local_19b)))) {
    type.super_IVariant.self.id = 0xd;
  }
  name.field_2._8_8_ = active_locations;
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(local_218,this,(ulong)uVar2,1);
  if ((local_199 & 1) == 0) {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])
              (&local_658,this,(undefined1 *)((long)&binding.field_2 + 8),local_218,0);
    CompilerGLSL::
    statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
              (&this->super_CompilerGLSL,&local_658,(char (*) [4])0x68bfe3,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index,
               (char (*) [2])0x6815db);
    ::std::__cxx11::string::~string((string *)&local_658);
  }
  else {
    bVar1 = Compiler::has_decoration
                      ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationLocation);
    if (bVar1) {
      semantic.field_2._12_4_ = (var->super_IVariant).self.id;
      local_21c = Compiler::get_decoration
                            ((Compiler *)this,(ID)semantic.field_2._12_4_,DecorationLocation);
    }
    else {
      local_21c = emit_interface_block_in_struct::anon_class_8_1_33ba97e3::operator()
                            ((anon_class_8_1_33ba97e3 *)((long)&name.field_2 + 8));
    }
    ts_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)var->storage;
    to_semantic_abi_cxx11_
              ((string *)local_248,this,local_21c,
               *(ExecutionModel *)&type.member_name_cache._M_h._M_single_bucket[0x1d]._M_nxt,
               var->storage);
    if (((local_19a & 1) == 0) || (type.width < 2)) {
      SPIRType::SPIRType((SPIRType *)local_5d0,(SPIRType *)((long)&binding.field_2 + 8));
      if (*(int *)&type.member_name_cache._M_h._M_single_bucket[0x1d]._M_nxt == 0x14f5) {
        itr = VectorView<unsigned_int>::begin((VectorView<unsigned_int> *)&decl_type.vecsize);
        SmallVector<unsigned_int,_8UL>::erase
                  ((SmallVector<unsigned_int,_8UL> *)&decl_type.vecsize,itr);
        itr_00 = VectorView<bool>::begin
                           ((VectorView<bool> *)(decl_type.array.stack_storage.aligned_char + 0x18))
        ;
        SmallVector<bool,_8UL>::erase
                  ((SmallVector<bool,_8UL> *)(decl_type.array.stack_storage.aligned_char + 0x18),
                   itr_00);
      }
      local_5f4 = (var->super_IVariant).self.id;
      pBVar5 = Compiler::get_decoration_bitset((Compiler *)this,(ID)local_5f4);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x35])(&local_5f0,this,pBVar5);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])
                (&i_1,this,local_5d0,local_218,0);
      CompilerGLSL::
      statement<std::__cxx11::string,std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                (&this->super_CompilerGLSL,&local_5f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_1,
                 (char (*) [4])0x68bfe3,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248,
                 (char (*) [2])0x6815db);
      ::std::__cxx11::string::~string((string *)&i_1);
      ::std::__cxx11::string::~string((string *)&local_5f0);
      local_61c = type_to_consumed_locations(this,(SPIRType *)local_5d0);
      for (local_620 = 0; local_620 < local_61c; local_620 = local_620 + 1) {
        local_624 = local_21c + local_620;
        pVar6 = ::std::
                unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                ::insert(active_locations,&local_624);
        local_638._M_cur =
             (__node_type *)pVar6.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
        local_630 = pVar6.second;
      }
      SPIRType::~SPIRType((SPIRType *)local_5d0);
    }
    else {
      bVar1 = VectorView<unsigned_int>::empty((VectorView<unsigned_int> *)&type.vecsize);
      if (!bVar1) {
        pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (pCVar4,"Arrays of matrices used as input/output. This is not supported.");
        __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      for (newtype.member_name_cache._M_h._M_single_bucket._4_4_ = 0;
          newtype.member_name_cache._M_h._M_single_bucket._4_4_ < type.width;
          newtype.member_name_cache._M_h._M_single_bucket._4_4_ =
               newtype.member_name_cache._M_h._M_single_bucket._4_4_ + 1) {
        SPIRType::SPIRType((SPIRType *)((long)&effective_semantic.field_2 + 8),
                           (SPIRType *)((long)&binding.field_2 + 8));
        newtype.width = 1;
        ::std::__cxx11::string::string((string *)local_3c0);
        if (((this->hlsl_options).flatten_matrix_vertex_input_semantics & 1U) == 0) {
          join<std::__cxx11::string&,char_const(&)[2],unsigned_int&>
                    (&local_400,(spirv_cross *)local_248,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x66305e,
                     (char (*) [2])((long)&newtype.member_name_cache._M_h._M_single_bucket + 4),
                     (uint *)ts_3);
          ::std::__cxx11::string::operator=((string *)local_3c0,(string *)&local_400);
          ::std::__cxx11::string::~string((string *)&local_400);
        }
        else {
          ts_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (ulong)var->storage;
          to_semantic_abi_cxx11_
                    (&local_3e0,this,local_21c,
                     *(ExecutionModel *)&type.member_name_cache._M_h._M_single_bucket[0x1d]._M_nxt,
                     var->storage);
          ::std::__cxx11::string::operator=((string *)local_3c0,(string *)&local_3e0);
          ::std::__cxx11::string::~string((string *)&local_3e0);
        }
        local_424 = (var->super_IVariant).self.id;
        pBVar5 = Compiler::get_decoration_bitset((Compiler *)this,(ID)local_424);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x35])(&local_420,this,pBVar5);
        join<std::__cxx11::string&,char_const(&)[2],unsigned_int&>
                  (&local_468,local_218,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x66305e,
                   (char (*) [2])((long)&newtype.member_name_cache._M_h._M_single_bucket + 4),
                   (uint *)ts_3);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])
                  (&local_448,this,(undefined1 *)((long)&effective_semantic.field_2 + 8),&local_468,
                   0);
        ts_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0;
        CompilerGLSL::
        statement<std::__cxx11::string,std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                  (&this->super_CompilerGLSL,&local_420,&local_448,(char (*) [4])0x68bfe3,ts_3,
                   (char (*) [2])0x6815db);
        ::std::__cxx11::string::~string((string *)&local_448);
        ::std::__cxx11::string::~string((string *)&local_468);
        ::std::__cxx11::string::~string((string *)&local_420);
        local_46c = local_21c;
        pVar6 = ::std::
                unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                ::insert(active_locations,&local_46c);
        decl_type.member_name_cache._M_h._M_single_bucket =
             (__node_base_ptr)pVar6.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
        ::std::__cxx11::string::~string((string *)local_3c0);
        SPIRType::~SPIRType((SPIRType *)((long)&effective_semantic.field_2 + 8));
        local_21c = local_21c + 1;
      }
    }
    ::std::__cxx11::string::~string((string *)local_248);
  }
  ::std::__cxx11::string::~string((string *)local_218);
  ::std::__cxx11::string::~string((string *)&index);
  SPIRType::~SPIRType((SPIRType *)((long)&binding.field_2 + 8));
  return;
}

Assistant:

void CompilerHLSL::emit_interface_block_in_struct(const SPIRVariable &var, unordered_set<uint32_t> &active_locations)
{
	auto &execution = get_entry_point();
	auto type = get<SPIRType>(var.basetype);

	string binding;
	bool use_location_number = true;
	bool need_matrix_unroll = false;
	bool legacy = hlsl_options.shader_model <= 30;
	if (execution.model == ExecutionModelFragment && var.storage == StorageClassOutput)
	{
		// Dual-source blending is achieved in HLSL by emitting to SV_Target0 and 1.
		uint32_t index = get_decoration(var.self, DecorationIndex);
		uint32_t location = get_decoration(var.self, DecorationLocation);

		if (index != 0 && location != 0)
			SPIRV_CROSS_THROW("Dual-source blending is only supported on MRT #0 in HLSL.");

		binding = join(legacy ? "COLOR" : "SV_Target", location + index);
		use_location_number = false;
		if (legacy) // COLOR must be a four-component vector on legacy shader model targets (HLSL ERR_COLOR_4COMP)
			type.vecsize = 4;
	}
	else if (var.storage == StorageClassInput && execution.model == ExecutionModelVertex)
	{
		need_matrix_unroll = true;
		if (legacy) // Inputs must be floating-point in legacy targets.
			type.basetype = SPIRType::Float;
	}

	const auto get_vacant_location = [&]() -> uint32_t {
		for (uint32_t i = 0; i < 64; i++)
			if (!active_locations.count(i))
				return i;
		SPIRV_CROSS_THROW("All locations from 0 to 63 are exhausted.");
	};

	auto name = to_name(var.self);
	if (use_location_number)
	{
		uint32_t location_number;

		// If an explicit location exists, use it with TEXCOORD[N] semantic.
		// Otherwise, pick a vacant location.
		if (has_decoration(var.self, DecorationLocation))
			location_number = get_decoration(var.self, DecorationLocation);
		else
			location_number = get_vacant_location();

		// Allow semantic remap if specified.
		auto semantic = to_semantic(location_number, execution.model, var.storage);

		if (need_matrix_unroll && type.columns > 1)
		{
			if (!type.array.empty())
				SPIRV_CROSS_THROW("Arrays of matrices used as input/output. This is not supported.");

			// Unroll matrices.
			for (uint32_t i = 0; i < type.columns; i++)
			{
				SPIRType newtype = type;
				newtype.columns = 1;

				string effective_semantic;
				if (hlsl_options.flatten_matrix_vertex_input_semantics)
					effective_semantic = to_semantic(location_number, execution.model, var.storage);
				else
					effective_semantic = join(semantic, "_", i);

				statement(to_interpolation_qualifiers(get_decoration_bitset(var.self)),
				          variable_decl(newtype, join(name, "_", i)), " : ", effective_semantic, ";");
				active_locations.insert(location_number++);
			}
		}
		else
		{
			auto decl_type = type;
			if (execution.model == ExecutionModelMeshEXT)
			{
				decl_type.array.erase(decl_type.array.begin());
				decl_type.array_size_literal.erase(decl_type.array_size_literal.begin());
			}
			statement(to_interpolation_qualifiers(get_decoration_bitset(var.self)), variable_decl(decl_type, name), " : ",
			          semantic, ";");

			// Structs and arrays should consume more locations.
			uint32_t consumed_locations = type_to_consumed_locations(decl_type);
			for (uint32_t i = 0; i < consumed_locations; i++)
				active_locations.insert(location_number + i);
		}
	}
	else
	{
		statement(variable_decl(type, name), " : ", binding, ";");
	}
}